

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O0

void printDeviceList(void)

{
  char *pcVar1;
  ostream *poVar2;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  uint local_20;
  uint local_1c;
  uint i;
  DWORD numDevs;
  FT_DEVICE_LIST_INFO_NODE *devInfo;
  FT_STATUS ftStatus;
  
  local_1c = 0;
  devInfo._4_4_ = FT_CreateDeviceInfoList(&local_1c);
  if (devInfo._4_4_ == 0) {
    if (local_1c == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No devices found!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Devices: ");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      _i = malloc((ulong)local_1c * 0x68);
      devInfo._4_4_ = FT_GetDeviceInfoList(_i,&local_1c);
      if (devInfo._4_4_ == 0) {
        for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
          poVar2 = std::operator<<((ostream *)&std::cout,"  ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
          poVar2 = std::operator<<(poVar2,": ");
          pcVar1 = (char *)((long)_i + (ulong)local_20 * 0x68 + 0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_60,pcVar1,&local_61);
          descriptionToName(local_40);
          poVar2 = std::operator<<(poVar2,(string *)local_40);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_40);
          std::__cxx11::string::~string(local_60);
          std::allocator<char>::~allocator((allocator<char> *)&local_61);
        }
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error getting device list!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      free(_i);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not read device list!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void printDeviceList() {
    FT_STATUS ftStatus;
    FT_DEVICE_LIST_INFO_NODE *devInfo;
    DWORD numDevs = 0;
    // create the device information list
    ftStatus = FT_CreateDeviceInfoList(&numDevs);
    if (ftStatus != FT_OK) {
        cerr << "Could not read device list!" << endl;
        return;
    }

    if (numDevs > 0) {
        cout << "Devices: " << endl;
        // allocate storage for list based on numDevs
        devInfo = (FT_DEVICE_LIST_INFO_NODE *) malloc(
                sizeof(FT_DEVICE_LIST_INFO_NODE) * numDevs);
        // get the device information list
        ftStatus = FT_GetDeviceInfoList(devInfo, &numDevs);
        if (ftStatus == FT_OK) {
            for (unsigned int i = 0; i < numDevs; i++) {
                cout << "  " << i << ": "
                     << descriptionToName(devInfo[i].Description) << endl;
            }
        } else {
            cerr << "Error getting device list!" << endl;
        }
        free(devInfo);
    } else {
        cout << "No devices found!" << endl;
    }
}